

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Func.h
# Opt level: O0

void __thiscall Cloner::~Cloner(Cloner *this)

{
  Cloner *this_local;
  
  if (this->symMap != (HashTable<StackSym_*,_Memory::ArenaAllocator> *)0x0) {
    Memory::
    DeleteObject<Memory::ArenaAllocator,(Memory::AllocatorDeleteFlags)0,HashTable<StackSym*,Memory::ArenaAllocator>>
              (&this->alloc->super_ArenaAllocator,this->symMap);
  }
  if (this->labelMap != (HashTable<IR::LabelInstr_*,_Memory::ArenaAllocator> *)0x0) {
    Memory::
    DeleteObject<Memory::ArenaAllocator,(Memory::AllocatorDeleteFlags)0,HashTable<IR::LabelInstr*,Memory::ArenaAllocator>>
              (&this->alloc->super_ArenaAllocator,this->labelMap);
  }
  return;
}

Assistant:

~Cloner()
    {
        if (symMap)
        {
            Adelete(alloc, symMap);
        }
        if (labelMap)
        {
            Adelete(alloc, labelMap);
        }
    }